

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_parse_url_options(connectdata *conn)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  char *value;
  size_t len;
  char *key;
  char *pcStack_30;
  _Bool reset;
  char *ptr;
  char *options;
  imap_conn *imapc;
  CURLcode result;
  connectdata *conn_local;
  
  imapc._4_4_ = CURLE_OK;
  pcStack_30 = conn->options;
  bVar1 = true;
  while( true ) {
    pcVar3 = pcStack_30;
    bVar4 = false;
    if (pcStack_30 != (char *)0x0) {
      bVar4 = *pcStack_30 != '\0';
    }
    if (!bVar4) break;
    while( true ) {
      bVar4 = false;
      if (*pcStack_30 != '\0') {
        bVar4 = *pcStack_30 != '=';
      }
      if (!bVar4) break;
      pcStack_30 = pcStack_30 + 1;
    }
    iVar2 = curl_strnequal(pcVar3,"AUTH",4);
    if (iVar2 == 0) {
      imapc._4_4_ = CURLE_URL_MALFORMAT;
    }
    else {
      value = (char *)0x0;
      pcVar3 = pcStack_30 + 1;
      pcStack_30 = pcVar3;
      if (bVar1) {
        bVar1 = false;
        (conn->proto).imapc.preftype = 0;
        (conn->proto).ftpc.dirdepth = 0;
      }
      while( true ) {
        bVar4 = false;
        if (*pcStack_30 != '\0') {
          bVar4 = *pcStack_30 != ';';
        }
        if (!bVar4) break;
        value = value + 1;
        pcStack_30 = pcStack_30 + 1;
      }
      iVar2 = curl_strnequal(pcVar3,"*",(size_t)value);
      if (iVar2 == 0) {
        iVar2 = curl_strnequal(pcVar3,"LOGIN",(size_t)value);
        if (iVar2 == 0) {
          iVar2 = curl_strnequal(pcVar3,"PLAIN",(size_t)value);
          if (iVar2 == 0) {
            iVar2 = curl_strnequal(pcVar3,"CRAM-MD5",(size_t)value);
            if (iVar2 == 0) {
              iVar2 = curl_strnequal(pcVar3,"DIGEST-MD5",(size_t)value);
              if (iVar2 == 0) {
                iVar2 = curl_strnequal(pcVar3,"GSSAPI",(size_t)value);
                if (iVar2 == 0) {
                  iVar2 = curl_strnequal(pcVar3,"NTLM",(size_t)value);
                  if (iVar2 == 0) {
                    iVar2 = curl_strnequal(pcVar3,"XOAUTH2",(size_t)value);
                    if (iVar2 != 0) {
                      (conn->proto).imapc.preftype = 2;
                      (conn->proto).imapc.prefmech = (conn->proto).imapc.prefmech | 0x80;
                    }
                  }
                  else {
                    (conn->proto).imapc.preftype = 2;
                    (conn->proto).imapc.prefmech = (conn->proto).imapc.prefmech | 0x40;
                  }
                }
                else {
                  (conn->proto).imapc.preftype = 2;
                  (conn->proto).imapc.prefmech = (conn->proto).imapc.prefmech | 0x10;
                }
              }
              else {
                (conn->proto).imapc.preftype = 2;
                (conn->proto).imapc.prefmech = (conn->proto).imapc.prefmech | 8;
              }
            }
            else {
              (conn->proto).imapc.preftype = 2;
              (conn->proto).imapc.prefmech = (conn->proto).imapc.prefmech | 4;
            }
          }
          else {
            (conn->proto).imapc.preftype = 2;
            (conn->proto).imapc.prefmech = (conn->proto).imapc.prefmech | 2;
          }
        }
        else {
          (conn->proto).imapc.preftype = 2;
          (conn->proto).imapc.prefmech = (conn->proto).imapc.prefmech | 1;
        }
      }
      else {
        (conn->proto).imapc.preftype = 0xffffffff;
        (conn->proto).ftpc.dirdepth = -1;
      }
      if (*pcStack_30 == ';') {
        pcStack_30 = pcStack_30 + 1;
      }
    }
  }
  return imapc._4_4_;
}

Assistant:

static CURLcode imap_parse_url_options(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct imap_conn *imapc = &conn->proto.imapc;
  const char *options = conn->options;
  const char *ptr = options;
  bool reset = TRUE;

  while(ptr && *ptr) {
    const char *key = ptr;

    while(*ptr && *ptr != '=')
        ptr++;

    if(strnequal(key, "AUTH", 4)) {
      size_t len = 0;
      const char *value = ++ptr;

      if(reset) {
        reset = FALSE;
        imapc->preftype = IMAP_TYPE_NONE;
        imapc->prefmech = SASL_AUTH_NONE;
      }

      while(*ptr && *ptr != ';') {
        ptr++;
        len++;
      }

      if(strnequal(value, "*", len)) {
        imapc->preftype = IMAP_TYPE_ANY;
        imapc->prefmech = SASL_AUTH_ANY;
      }
      else if(strnequal(value, SASL_MECH_STRING_LOGIN, len)) {
        imapc->preftype = IMAP_TYPE_SASL;
        imapc->prefmech |= SASL_MECH_LOGIN;
      }
      else if(strnequal(value, SASL_MECH_STRING_PLAIN, len)) {
        imapc->preftype = IMAP_TYPE_SASL;
        imapc->prefmech |= SASL_MECH_PLAIN;
      }
      else if(strnequal(value, SASL_MECH_STRING_CRAM_MD5, len)) {
        imapc->preftype = IMAP_TYPE_SASL;
        imapc->prefmech |= SASL_MECH_CRAM_MD5;
      }
      else if(strnequal(value, SASL_MECH_STRING_DIGEST_MD5, len)) {
        imapc->preftype = IMAP_TYPE_SASL;
        imapc->prefmech |= SASL_MECH_DIGEST_MD5;
      }
      else if(strnequal(value, SASL_MECH_STRING_GSSAPI, len)) {
        imapc->preftype = IMAP_TYPE_SASL;
        imapc->prefmech |= SASL_MECH_GSSAPI;
      }
      else if(strnequal(value, SASL_MECH_STRING_NTLM, len)) {
        imapc->preftype = IMAP_TYPE_SASL;
        imapc->prefmech |= SASL_MECH_NTLM;
      }
      else if(strnequal(value, SASL_MECH_STRING_XOAUTH2, len)) {
        imapc->preftype = IMAP_TYPE_SASL;
        imapc->prefmech |= SASL_MECH_XOAUTH2;
      }

      if(*ptr == ';')
        ptr++;
    }
    else
      result = CURLE_URL_MALFORMAT;
  }

  return result;
}